

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O1

shared_ptr<apache::thrift::TProcessor> __thiscall
jaegertracing::thrift::AggregationValidatorProcessorFactory::getProcessor
          (AggregationValidatorProcessorFactory *this,TConnectionInfo *connInfo)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  AggregationValidatorIf *__p;
  AggregationValidatorProcessor *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<apache::thrift::TProcessor> sVar3;
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf> handler;
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf> local_50;
  ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory> local_40;
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf> local_30;
  
  peVar1 = *(element_type **)(connInfo + 8);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(connInfo + 0x10);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  __p = (AggregationValidatorIf *)(**(code **)(**(long **)(connInfo + 8) + 0x10))();
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_40.handlerFactory_.
  super___shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_40.handlerFactory_.
  super___shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = this_00;
  std::shared_ptr<jaegertracing::thrift::AggregationValidatorIf>::
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf,apache::thrift::ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory>,void>
            (&local_30,__p,&local_40);
  if (local_40.handlerFactory_.
      super___shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.handlerFactory_.
               super___shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  this_01 = (AggregationValidatorProcessor *)operator_new(0x58);
  local_50.
  super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_30.
           super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_50.
  super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_30.
       super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_30.
      super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.
       super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.
       super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  AggregationValidatorProcessor::AggregationValidatorProcessor(this_01,&local_50);
  *(AggregationValidatorProcessor **)this = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<jaegertracing::thrift::AggregationValidatorProcessor*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->handlerFactory_,this_01);
  _Var2._M_pi = extraout_RDX;
  if (local_50.
      super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_30.
      super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var2._M_pi = extraout_RDX_02;
  }
  sVar3.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<apache::thrift::TProcessor>)
         sVar3.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

::apache::thrift::stdcxx::shared_ptr< ::apache::thrift::TProcessor > AggregationValidatorProcessorFactory::getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) {
  ::apache::thrift::ReleaseHandler< AggregationValidatorIfFactory > cleanup(handlerFactory_);
  ::apache::thrift::stdcxx::shared_ptr< AggregationValidatorIf > handler(handlerFactory_->getHandler(connInfo), cleanup);
  ::apache::thrift::stdcxx::shared_ptr< ::apache::thrift::TProcessor > processor(new AggregationValidatorProcessor(handler));
  return processor;
}